

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

size_t get_next_version_component(char **str,component_t *component,int flags)

{
  int iVar1;
  char *pcVar2;
  component_t *pcVar3;
  int flags_local;
  component_t *component_local;
  char **str_local;
  
  pcVar2 = skip_separator(*str);
  *str = pcVar2;
  if (**str == '\0') {
    make_default_component(component,flags);
  }
  else {
    parse_token_to_component(str,component,flags);
    iVar1 = my_isalpha(**str);
    if (iVar1 != 0) {
      pcVar3 = component + 1;
      component[1].start = *str;
      pcVar2 = skip_alpha(*str);
      component[1].end = pcVar2;
      iVar1 = my_isnumber(*component[1].end);
      if (iVar1 == 0) {
        iVar1 = classify_keyword(component[1].start,component[1].end,flags);
        if (iVar1 == 0) {
          pcVar3->metaorder = 5;
        }
        else if (iVar1 == 1) {
          pcVar3->metaorder = 1;
        }
        else if (iVar1 == 2) {
          pcVar3->metaorder = 3;
        }
        *str = component[1].end;
        return 2;
      }
    }
  }
  return 1;
}

Assistant:

size_t get_next_version_component(const char** str, component_t* component, int flags) {
	*str = skip_separator(*str);

	if (**str == '\0') {
		make_default_component(component, flags);
		return 1;
	}

	parse_token_to_component(str, component, flags);

	/* Special case for letter suffix:
	 * - We taste whether the next component is alpha not followed by a number,
	 *   e.g 1a, 1a.1, but not 1a1
	 * - We check whether it's known keyword (in which case it's treated normally)
	 * - Otherwise, it's treated as letter suffix
	 */
	if (my_isalpha(**str)) {
		++component;

		component->start = *str;
		component->end = skip_alpha(*str);

		if (!my_isnumber(*component->end)) {
			switch (classify_keyword(component->start, component->end, flags)) {
			case KEYWORD_UNKNOWN:
				component->metaorder = METAORDER_LETTER_SUFFIX;
				break;
			case KEYWORD_PRE_RELEASE:
				component->metaorder = METAORDER_PRE_RELEASE;
				break;
			case KEYWORD_POST_RELEASE:
				component->metaorder = METAORDER_POST_RELEASE;
				break;
			}

			*str = component->end;
			return 2;
		}
	}

	return 1;
}